

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * operator+=(QString *a,QStringBuilder<char16_t,_QString> *b)

{
  ArrayOptions *pAVar1;
  char16_t *pcVar2;
  ulong alloc;
  Data *pDVar3;
  long lVar4;
  ulong alloc_00;
  char16_t *pcVar5;
  long lVar6;
  ulong uVar7;
  
  pDVar3 = (a->d).d;
  alloc_00 = (a->d).size;
  uVar7 = alloc_00 + (b->b).d.size + 1;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData(a,alloc_00,KeepSize);
    pDVar3 = (a->d).d;
    alloc_00 = (a->d).size;
    alloc = uVar7;
    if (pDVar3 != (Data *)0x0) goto LAB_00262400;
LAB_00262448:
    if (alloc < alloc_00) {
      alloc = alloc_00;
    }
    QString::reallocData(a,alloc,KeepSize);
    pDVar3 = (a->d).d;
    if (pDVar3 != (Data *)0x0) {
      lVar4 = (pDVar3->super_QArrayData).alloc;
LAB_0026246b:
      if (lVar4 != 0) {
        pAVar1 = &(pDVar3->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
      goto LAB_00262474;
    }
  }
  else {
LAB_00262400:
    lVar4 = (pDVar3->super_QArrayData).alloc;
    lVar6 = (long)((long)(a->d).ptr -
                  ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1
    ;
    if ((long)((lVar4 - alloc_00) - lVar6) < (long)uVar7) {
      alloc = lVar4 * 2;
      if (lVar4 * 2 < (long)uVar7) {
        alloc = uVar7;
      }
      if ((1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar4 - lVar6 <= (long)alloc)) goto LAB_00262448;
      goto LAB_0026246b;
    }
LAB_00262474:
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_0026248c;
  }
  QString::reallocData(a,(a->d).size,KeepSize);
LAB_0026248c:
  pcVar5 = (a->d).ptr;
  pcVar2 = pcVar5 + (a->d).size;
  *pcVar2 = b->a;
  lVar4 = (b->b).d.size;
  if (lVar4 != 0) {
    pcVar5 = (b->b).d.ptr;
    if (pcVar5 == (char16_t *)0x0) {
      pcVar5 = &QString::_empty;
    }
    memcpy(pcVar2 + 1,pcVar5,lVar4 * 2);
    pcVar5 = (a->d).ptr;
  }
  if (pcVar5 == (char16_t *)0x0) {
    pcVar5 = &QString::_empty;
  }
  QString::resize(a,(long)(pcVar2 + 1) + (lVar4 * 2 - (long)pcVar5) >> 1);
  return a;
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}